

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int isSelPropNewValueNotify(Display *display,XEvent *event,XPointer pointer)

{
  bool local_21;
  XEvent *notification;
  XPointer pointer_local;
  XEvent *event_local;
  Display *display_local;
  
  local_21 = false;
  if (((event->type == 0x1c) && (local_21 = false, (event->xexpose).count == 0)) &&
     (local_21 = false, (event->xany).window == *(Window *)(pointer + 0x20))) {
    local_21 = (event->xkey).root == *(Window *)(pointer + 0x38);
  }
  return (int)local_21;
}

Assistant:

static Bool isSelPropNewValueNotify(Display* display, XEvent* event, XPointer pointer)
{
    XEvent* notification = (XEvent*) pointer;
    return event->type == PropertyNotify &&
           event->xproperty.state == PropertyNewValue &&
           event->xproperty.window == notification->xselection.requestor &&
           event->xproperty.atom == notification->xselection.property;
}